

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  int iVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar25;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  float fVar32;
  float fVar33;
  float fVar54;
  float fVar56;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar55;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar53;
  float fVar60;
  float fVar66;
  float fVar67;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar68;
  float fVar76;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar71;
  float fVar77;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar78;
  float fVar87;
  float fVar88;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar82;
  float fVar89;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  float fVar99;
  float fVar100;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar97;
  float fVar101;
  undefined1 auVar98 [16];
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  float fVar109;
  float fVar110;
  undefined1 auVar107 [16];
  float fVar111;
  undefined1 auVar108 [16];
  float fVar112;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar113 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar135 [16];
  float fVar139;
  float fVar140;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  vbool<4> valid;
  undefined1 local_11e8 [16];
  undefined1 (*local_11d8) [16];
  ulong local_11d0;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  float local_1108 [4];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined4 local_fd8;
  undefined4 uStack_fd4;
  undefined4 uStack_fd0;
  undefined4 uStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar25 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar59 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar89 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar111 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar133 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar139 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar146 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar152 = fVar133 * 0.99999964;
  fVar102 = fVar139 * 0.99999964;
  fVar151 = fVar146 * 0.99999964;
  fVar133 = fVar133 * 1.0000004;
  fVar139 = fVar139 * 1.0000004;
  fVar146 = fVar146 * 1.0000004;
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar15 = (tray->tnear).field_0.i[k];
  auVar107._4_4_ = iVar15;
  auVar107._0_4_ = iVar15;
  auVar107._8_4_ = iVar15;
  auVar107._12_4_ = iVar15;
  iVar15 = (tray->tfar).field_0.i[k];
  auVar44._4_4_ = iVar15;
  auVar44._0_4_ = iVar15;
  auVar44._8_4_ = iVar15;
  auVar44._12_4_ = iVar15;
  local_11d8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1058 = fVar59;
  fStack_1054 = fVar59;
  fStack_1050 = fVar59;
  fStack_104c = fVar59;
  local_1068 = fVar89;
  fStack_1064 = fVar89;
  fStack_1060 = fVar89;
  fStack_105c = fVar89;
  local_1078 = fVar111;
  fStack_1074 = fVar111;
  fStack_1070 = fVar111;
  fStack_106c = fVar111;
  local_1088 = fVar133;
  fStack_1084 = fVar133;
  fStack_1080 = fVar133;
  fStack_107c = fVar133;
  local_1098 = fVar139;
  fStack_1094 = fVar139;
  fStack_1090 = fVar139;
  fStack_108c = fVar139;
  local_10a8 = fVar146;
  fStack_10a4 = fVar146;
  fStack_10a0 = fVar146;
  fStack_109c = fVar146;
  local_10b8 = fVar151;
  fStack_10b4 = fVar151;
  fStack_10b0 = fVar151;
  fStack_10ac = fVar151;
  local_10c8 = fVar152;
  fStack_10c4 = fVar152;
  fStack_10c0 = fVar152;
  fStack_10bc = fVar152;
  fVar32 = fVar89;
  fVar33 = fVar89;
  fVar54 = fVar89;
  fVar55 = fVar111;
  fVar56 = fVar111;
  fVar57 = fVar111;
  fVar58 = fVar146;
  fVar60 = fVar146;
  fVar66 = fVar146;
  fVar67 = fVar151;
  fVar68 = fVar151;
  fVar76 = fVar151;
  fVar77 = fVar152;
  fVar78 = fVar152;
  fVar87 = fVar152;
  fVar88 = fVar59;
  fVar93 = fVar59;
  fVar99 = fVar59;
  fVar100 = fVar133;
  fVar101 = fVar133;
  fVar106 = fVar133;
  fVar109 = fVar139;
  fVar110 = fVar139;
  fVar112 = fVar139;
LAB_006ef23f:
  do {
    do {
      if (pSVar25 == stack) {
        return;
      }
      pSVar18 = pSVar25 + -1;
      pSVar25 = pSVar25 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar18->dist &&
             (float)pSVar18->dist != *(float *)(ray + k * 4 + 0x80));
    pSVar18 = stack;
    pSVar26 = (StackItemT<embree::NodeRefPtr<4>_> *)(pSVar25->ptr).ptr;
    while (((ulong)pSVar26 & 8) == 0) {
      pfVar1 = (float *)((long)&pSVar26[2].ptr.ptr + uVar22);
      auVar34._0_4_ = (*pfVar1 - fVar59) * fVar152;
      auVar34._4_4_ = (pfVar1[1] - fVar88) * fVar77;
      auVar34._8_4_ = (pfVar1[2] - fVar93) * fVar78;
      auVar34._12_4_ = (pfVar1[3] - fVar99) * fVar87;
      pfVar1 = (float *)((long)&pSVar26[2].ptr.ptr + uVar24);
      auVar95._0_4_ = (*pfVar1 - fVar89) * fVar102;
      auVar95._4_4_ = (pfVar1[1] - fVar32) * fVar102;
      auVar95._8_4_ = (pfVar1[2] - fVar33) * fVar102;
      auVar95._12_4_ = (pfVar1[3] - fVar54) * fVar102;
      auVar34 = maxps(auVar34,auVar95);
      pfVar1 = (float *)((long)&pSVar26[2].ptr.ptr + uVar21);
      auVar96._0_4_ = (*pfVar1 - fVar111) * fVar151;
      auVar96._4_4_ = (pfVar1[1] - fVar55) * fVar67;
      auVar96._8_4_ = (pfVar1[2] - fVar56) * fVar68;
      auVar96._12_4_ = (pfVar1[3] - fVar57) * fVar76;
      auVar69 = maxps(auVar96,auVar107);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar34,auVar69);
      pfVar1 = (float *)((long)&pSVar26[2].ptr.ptr + (uVar22 ^ 0x10));
      auVar104._0_4_ = (*pfVar1 - fVar59) * fVar133;
      auVar104._4_4_ = (pfVar1[1] - fVar88) * fVar100;
      auVar104._8_4_ = (pfVar1[2] - fVar93) * fVar101;
      auVar104._12_4_ = (pfVar1[3] - fVar99) * fVar106;
      pfVar1 = (float *)((long)&pSVar26[2].ptr.ptr + (uVar24 ^ 0x10));
      auVar79._0_4_ = (*pfVar1 - fVar89) * fVar139;
      auVar79._4_4_ = (pfVar1[1] - fVar32) * fVar109;
      auVar79._8_4_ = (pfVar1[2] - fVar33) * fVar110;
      auVar79._12_4_ = (pfVar1[3] - fVar54) * fVar112;
      auVar34 = minps(auVar104,auVar79);
      pfVar1 = (float *)((long)&pSVar26[2].ptr.ptr + (uVar21 ^ 0x10));
      auVar80._0_4_ = (*pfVar1 - fVar111) * fVar146;
      auVar80._4_4_ = (pfVar1[1] - fVar55) * fVar58;
      auVar80._8_4_ = (pfVar1[2] - fVar56) * fVar60;
      auVar80._12_4_ = (pfVar1[3] - fVar57) * fVar66;
      auVar69 = minps(auVar80,auVar44);
      auVar34 = minps(auVar34,auVar69);
      auVar69._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar34._4_4_);
      auVar69._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar34._0_4_);
      auVar69._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar34._8_4_);
      auVar69._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar34._12_4_);
      uVar14 = movmskps((int)pSVar18,auVar69);
      if (uVar14 == 0) goto LAB_006ef23f;
      uVar14 = uVar14 & 0xff;
      uVar27 = (ulong)pSVar26 & 0xfffffffffffffff0;
      lVar20 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
      pSVar18 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar27 + lVar20 * 8);
      uVar14 = uVar14 - 1 & uVar14;
      pSVar26 = pSVar18;
      if (uVar14 != 0) {
        uVar29 = tNear.field_0.i[lVar20];
        lVar20 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
          }
        }
        pSVar26 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar27 + lVar20 * 8);
        uVar30 = tNear.field_0.i[lVar20];
        uVar14 = uVar14 - 1 & uVar14;
        if (uVar14 == 0) {
          if (uVar29 < uVar30) {
            (pSVar25->ptr).ptr = (size_t)pSVar26;
            pSVar25->dist = uVar30;
            pSVar25 = pSVar25 + 1;
            pSVar26 = pSVar18;
          }
          else {
            (pSVar25->ptr).ptr = (size_t)pSVar18;
            pSVar25->dist = uVar29;
            pSVar18 = pSVar26;
            pSVar25 = pSVar25 + 1;
          }
        }
        else {
          auVar70._8_4_ = uVar29;
          auVar70._0_8_ = pSVar18;
          auVar70._12_4_ = 0;
          auVar90._8_4_ = uVar30;
          auVar90._0_8_ = pSVar26;
          auVar90._12_4_ = 0;
          lVar20 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
            }
          }
          uVar6 = *(undefined8 *)(uVar27 + lVar20 * 8);
          iVar15 = tNear.field_0.i[lVar20];
          auVar81._8_4_ = iVar15;
          auVar81._0_8_ = uVar6;
          auVar81._12_4_ = 0;
          auVar35._8_4_ = -(uint)((int)uVar29 < (int)uVar30);
          uVar14 = uVar14 - 1 & uVar14;
          if (uVar14 == 0) {
            auVar35._4_4_ = auVar35._8_4_;
            auVar35._0_4_ = auVar35._8_4_;
            auVar35._12_4_ = auVar35._8_4_;
            auVar94._8_4_ = uVar30;
            auVar94._0_8_ = pSVar26;
            auVar94._12_4_ = 0;
            auVar95 = blendvps(auVar94,auVar70,auVar35);
            auVar34 = blendvps(auVar70,auVar90,auVar35);
            auVar36._8_4_ = -(uint)(auVar95._8_4_ < iVar15);
            auVar36._4_4_ = auVar36._8_4_;
            auVar36._0_4_ = auVar36._8_4_;
            auVar36._12_4_ = auVar36._8_4_;
            auVar91._8_4_ = iVar15;
            auVar91._0_8_ = uVar6;
            auVar91._12_4_ = 0;
            auVar69 = blendvps(auVar91,auVar95,auVar36);
            auVar95 = blendvps(auVar95,auVar81,auVar36);
            auVar37._8_4_ = -(uint)(auVar34._8_4_ < auVar95._8_4_);
            auVar37._4_4_ = auVar37._8_4_;
            auVar37._0_4_ = auVar37._8_4_;
            auVar37._12_4_ = auVar37._8_4_;
            SVar82 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar95,auVar34,auVar37);
            SVar71 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar34,auVar95,auVar37);
            *pSVar25 = SVar71;
            pSVar25[1] = SVar82;
            pSVar18 = auVar69._0_8_;
            pSVar25 = pSVar25 + 2;
            pSVar26 = pSVar18;
          }
          else {
            lVar20 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            auVar38._4_4_ = auVar35._8_4_;
            auVar38._0_4_ = auVar35._8_4_;
            auVar38._8_4_ = auVar35._8_4_;
            auVar38._12_4_ = auVar35._8_4_;
            auVar96 = blendvps(auVar90,auVar70,auVar38);
            auVar34 = blendvps(auVar70,auVar90,auVar38);
            auVar103._8_4_ = tNear.field_0.i[lVar20];
            auVar103._0_8_ = *(undefined8 *)(uVar27 + lVar20 * 8);
            auVar103._12_4_ = 0;
            auVar39._8_4_ = -(uint)(iVar15 < tNear.field_0.i[lVar20]);
            auVar39._4_4_ = auVar39._8_4_;
            auVar39._0_4_ = auVar39._8_4_;
            auVar39._12_4_ = auVar39._8_4_;
            auVar95 = blendvps(auVar103,auVar81,auVar39);
            auVar69 = blendvps(auVar81,auVar103,auVar39);
            auVar40._8_4_ = -(uint)(auVar34._8_4_ < auVar69._8_4_);
            auVar40._4_4_ = auVar40._8_4_;
            auVar40._0_4_ = auVar40._8_4_;
            auVar40._12_4_ = auVar40._8_4_;
            auVar104 = blendvps(auVar69,auVar34,auVar40);
            SVar71 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar34,auVar69,auVar40);
            auVar41._8_4_ = -(uint)(auVar96._8_4_ < auVar95._8_4_);
            auVar41._4_4_ = auVar41._8_4_;
            auVar41._0_4_ = auVar41._8_4_;
            auVar41._12_4_ = auVar41._8_4_;
            auVar34 = blendvps(auVar95,auVar96,auVar41);
            auVar69 = blendvps(auVar96,auVar95,auVar41);
            auVar42._8_4_ = -(uint)(auVar69._8_4_ < auVar104._8_4_);
            auVar42._4_4_ = auVar42._8_4_;
            auVar42._0_4_ = auVar42._8_4_;
            auVar42._12_4_ = auVar42._8_4_;
            SVar82 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar104,auVar69,auVar42);
            SVar97 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar69,auVar104,auVar42);
            *pSVar25 = SVar71;
            pSVar25[1] = SVar97;
            pSVar25[2] = SVar82;
            pSVar18 = auVar34._0_8_;
            pSVar25 = pSVar25 + 3;
            pSVar26 = pSVar18;
          }
        }
      }
    }
    uVar27 = (ulong)((uint)pSVar26 & 0xf) - 8;
    uVar28 = (ulong)pSVar26 & 0xfffffffffffffff0;
    local_11d0 = uVar27;
    for (uVar23 = 0; uVar23 != local_11d0; uVar23 = uVar23 + 1) {
      lVar20 = uVar23 * 0xb0;
      fVar59 = *(float *)(ray + k * 4);
      fVar89 = *(float *)(ray + k * 4 + 0x10);
      fVar111 = *(float *)(ray + k * 4 + 0x20);
      pfVar1 = (float *)(uVar28 + lVar20);
      pfVar2 = (float *)(uVar28 + 0x10 + lVar20);
      pfVar3 = (float *)(uVar28 + 0x20 + lVar20);
      pfVar4 = (float *)(uVar28 + 0x30 + lVar20);
      fVar153 = *pfVar1 - fVar59;
      fVar155 = pfVar1[1] - fVar59;
      fVar157 = pfVar1[2] - fVar59;
      fVar159 = pfVar1[3] - fVar59;
      fVar125 = *pfVar2 - fVar89;
      fVar127 = pfVar2[1] - fVar89;
      fVar129 = pfVar2[2] - fVar89;
      fVar131 = pfVar2[3] - fVar89;
      fVar147 = *pfVar3 - fVar111;
      fVar148 = pfVar3[1] - fVar111;
      fVar149 = pfVar3[2] - fVar111;
      fVar150 = pfVar3[3] - fVar111;
      fVar32 = *pfVar4 - fVar59;
      fVar54 = pfVar4[1] - fVar59;
      fVar56 = pfVar4[2] - fVar59;
      fVar58 = pfVar4[3] - fVar59;
      pfVar1 = (float *)(uVar28 + 0x40 + lVar20);
      fVar68 = *pfVar1 - fVar89;
      fVar76 = pfVar1[1] - fVar89;
      fVar152 = pfVar1[2] - fVar89;
      fVar77 = pfVar1[3] - fVar89;
      pfVar1 = (float *)(uVar28 + 0x50 + lVar20);
      fVar93 = *pfVar1 - fVar111;
      fVar99 = pfVar1[1] - fVar111;
      fVar100 = pfVar1[2] - fVar111;
      fVar101 = pfVar1[3] - fVar111;
      pfVar1 = (float *)(uVar28 + 0x60 + lVar20);
      fVar33 = *pfVar1 - fVar59;
      fVar55 = pfVar1[1] - fVar59;
      fVar57 = pfVar1[2] - fVar59;
      fVar59 = pfVar1[3] - fVar59;
      pfVar1 = (float *)(uVar28 + 0x70 + lVar20);
      fVar78 = *pfVar1 - fVar89;
      fVar87 = pfVar1[1] - fVar89;
      fVar88 = pfVar1[2] - fVar89;
      fVar89 = pfVar1[3] - fVar89;
      pfVar1 = (float *)(uVar28 + 0x80 + lVar20);
      fVar106 = *pfVar1 - fVar111;
      fVar109 = pfVar1[1] - fVar111;
      fVar110 = pfVar1[2] - fVar111;
      fVar111 = pfVar1[3] - fVar111;
      fVar117 = fVar33 - fVar153;
      fVar119 = fVar55 - fVar155;
      fVar121 = fVar57 - fVar157;
      fVar123 = fVar59 - fVar159;
      fVar140 = fVar78 - fVar125;
      fVar143 = fVar87 - fVar127;
      fVar144 = fVar88 - fVar129;
      fVar145 = fVar89 - fVar131;
      local_1018 = fVar106 - fVar147;
      fStack_1014 = fVar109 - fVar148;
      fStack_1010 = fVar110 - fVar149;
      fStack_100c = fVar111 - fVar150;
      fVar133 = *(float *)(ray + k * 4 + 0x50);
      fVar139 = *(float *)(ray + k * 4 + 0x60);
      fVar146 = *(float *)(ray + k * 4 + 0x40);
      local_1048 = (fVar140 * (fVar147 + fVar106) - (fVar125 + fVar78) * local_1018) * fVar146 +
                   ((fVar153 + fVar33) * local_1018 - (fVar147 + fVar106) * fVar117) * fVar133 +
                   (fVar117 * (fVar125 + fVar78) - (fVar153 + fVar33) * fVar140) * fVar139;
      fStack_1044 = (fVar143 * (fVar148 + fVar109) - (fVar127 + fVar87) * fStack_1014) * fVar146 +
                    ((fVar155 + fVar55) * fStack_1014 - (fVar148 + fVar109) * fVar119) * fVar133 +
                    (fVar119 * (fVar127 + fVar87) - (fVar155 + fVar55) * fVar143) * fVar139;
      fStack_1040 = (fVar144 * (fVar149 + fVar110) - (fVar129 + fVar88) * fStack_1010) * fVar146 +
                    ((fVar157 + fVar57) * fStack_1010 - (fVar149 + fVar110) * fVar121) * fVar133 +
                    (fVar121 * (fVar129 + fVar88) - (fVar157 + fVar57) * fVar144) * fVar139;
      fStack_103c = (fVar145 * (fVar150 + fVar111) - (fVar131 + fVar89) * fStack_100c) * fVar146 +
                    ((fVar159 + fVar59) * fStack_100c - (fVar150 + fVar111) * fVar123) * fVar133 +
                    (fVar123 * (fVar131 + fVar89) - (fVar159 + fVar59) * fVar145) * fVar139;
      fVar60 = fVar153 - fVar32;
      fVar66 = fVar155 - fVar54;
      fVar151 = fVar157 - fVar56;
      fVar67 = fVar159 - fVar58;
      fVar112 = fVar125 - fVar68;
      fVar114 = fVar127 - fVar76;
      fVar115 = fVar129 - fVar152;
      fVar116 = fVar131 - fVar77;
      fVar134 = fVar147 - fVar93;
      fVar136 = fVar148 - fVar99;
      fVar137 = fVar149 - fVar100;
      fVar138 = fVar150 - fVar101;
      local_1028._0_4_ =
           (fVar112 * (fVar147 + fVar93) - (fVar125 + fVar68) * fVar134) * fVar146 +
           ((fVar153 + fVar32) * fVar134 - (fVar147 + fVar93) * fVar60) * fVar133 +
           (fVar60 * (fVar125 + fVar68) - (fVar153 + fVar32) * fVar112) * fVar139;
      local_1028._4_4_ =
           (fVar114 * (fVar148 + fVar99) - (fVar127 + fVar76) * fVar136) * fVar146 +
           ((fVar155 + fVar54) * fVar136 - (fVar148 + fVar99) * fVar66) * fVar133 +
           (fVar66 * (fVar127 + fVar76) - (fVar155 + fVar54) * fVar114) * fVar139;
      local_1028._8_4_ =
           (fVar115 * (fVar149 + fVar100) - (fVar129 + fVar152) * fVar137) * fVar146 +
           ((fVar157 + fVar56) * fVar137 - (fVar149 + fVar100) * fVar151) * fVar133 +
           (fVar151 * (fVar129 + fVar152) - (fVar157 + fVar56) * fVar115) * fVar139;
      local_1028._12_4_ =
           (fVar116 * (fVar150 + fVar101) - (fVar131 + fVar77) * fVar138) * fVar146 +
           ((fVar159 + fVar58) * fVar138 - (fVar150 + fVar101) * fVar67) * fVar133 +
           (fVar67 * (fVar131 + fVar77) - (fVar159 + fVar58) * fVar116) * fVar139;
      fVar118 = fVar32 - fVar33;
      fVar120 = fVar54 - fVar55;
      fVar122 = fVar56 - fVar57;
      fVar124 = fVar58 - fVar59;
      fVar154 = fVar68 - fVar78;
      fVar156 = fVar76 - fVar87;
      fVar158 = fVar152 - fVar88;
      fVar160 = fVar77 - fVar89;
      fVar126 = fVar93 - fVar106;
      fVar128 = fVar99 - fVar109;
      fVar130 = fVar100 - fVar110;
      fVar132 = fVar101 - fVar111;
      auVar72._0_4_ =
           (fVar154 * (fVar106 + fVar93) - (fVar78 + fVar68) * fVar126) * fVar146 +
           ((fVar33 + fVar32) * fVar126 - (fVar106 + fVar93) * fVar118) * fVar133 +
           (fVar118 * (fVar78 + fVar68) - (fVar33 + fVar32) * fVar154) * fVar139;
      auVar72._4_4_ =
           (fVar156 * (fVar109 + fVar99) - (fVar87 + fVar76) * fVar128) * fVar146 +
           ((fVar55 + fVar54) * fVar128 - (fVar109 + fVar99) * fVar120) * fVar133 +
           (fVar120 * (fVar87 + fVar76) - (fVar55 + fVar54) * fVar156) * fVar139;
      auVar72._8_4_ =
           (fVar158 * (fVar110 + fVar100) - (fVar88 + fVar152) * fVar130) * fVar146 +
           ((fVar57 + fVar56) * fVar130 - (fVar110 + fVar100) * fVar122) * fVar133 +
           (fVar122 * (fVar88 + fVar152) - (fVar57 + fVar56) * fVar158) * fVar139;
      auVar72._12_4_ =
           (fVar160 * (fVar111 + fVar101) - (fVar89 + fVar77) * fVar132) * fVar146 +
           ((fVar59 + fVar58) * fVar132 - (fVar111 + fVar101) * fVar124) * fVar133 +
           (fVar124 * (fVar89 + fVar77) - (fVar59 + fVar58) * fVar160) * fVar139;
      local_1038 = local_1028._0_4_ + local_1048 + auVar72._0_4_;
      fStack_1034 = local_1028._4_4_ + fStack_1044 + auVar72._4_4_;
      fStack_1030 = local_1028._8_4_ + fStack_1040 + auVar72._8_4_;
      fStack_102c = local_1028._12_4_ + fStack_103c + auVar72._12_4_;
      auVar43._4_4_ = fStack_1044;
      auVar43._0_4_ = local_1048;
      auVar43._8_4_ = fStack_1040;
      auVar43._12_4_ = fStack_103c;
      auVar44 = minps(auVar43,local_1028);
      auVar44 = minps(auVar44,auVar72);
      auVar83._4_4_ = fStack_1044;
      auVar83._0_4_ = local_1048;
      auVar83._8_4_ = fStack_1040;
      auVar83._12_4_ = fStack_103c;
      auVar34 = maxps(auVar83,local_1028);
      auVar34 = maxps(auVar34,auVar72);
      fVar59 = ABS(local_1038) * 1.1920929e-07;
      fVar89 = ABS(fStack_1034) * 1.1920929e-07;
      fVar111 = ABS(fStack_1030) * 1.1920929e-07;
      fVar32 = ABS(fStack_102c) * 1.1920929e-07;
      auVar84._4_4_ = -(uint)(auVar34._4_4_ <= fVar89);
      auVar84._0_4_ = -(uint)(auVar34._0_4_ <= fVar59);
      auVar84._8_4_ = -(uint)(auVar34._8_4_ <= fVar111);
      auVar84._12_4_ = -(uint)(auVar34._12_4_ <= fVar32);
      auVar45._4_4_ = -(uint)(-fVar89 <= auVar44._4_4_);
      auVar45._0_4_ = -(uint)(-fVar59 <= auVar44._0_4_);
      auVar45._8_4_ = -(uint)(-fVar111 <= auVar44._8_4_);
      auVar45._12_4_ = -(uint)(-fVar32 <= auVar44._12_4_);
      auVar84 = auVar84 | auVar45;
      uVar14 = movmskps((int)uVar27,auVar84);
      uVar27 = (ulong)uVar14;
      if (uVar14 != 0) {
        auVar98._0_4_ = fVar140 * fVar134 - fVar112 * local_1018;
        auVar98._4_4_ = fVar143 * fVar136 - fVar114 * fStack_1014;
        auVar98._8_4_ = fVar144 * fVar137 - fVar115 * fStack_1010;
        auVar98._12_4_ = fVar145 * fVar138 - fVar116 * fStack_100c;
        auVar113._0_4_ = fVar112 * fVar126 - fVar134 * fVar154;
        auVar113._4_4_ = fVar114 * fVar128 - fVar136 * fVar156;
        auVar113._8_4_ = fVar115 * fVar130 - fVar137 * fVar158;
        auVar113._12_4_ = fVar116 * fVar132 - fVar138 * fVar160;
        auVar46._4_4_ = -(uint)(ABS(fVar114 * fStack_1014) < ABS(fVar136 * fVar156));
        auVar46._0_4_ = -(uint)(ABS(fVar112 * local_1018) < ABS(fVar134 * fVar154));
        auVar46._8_4_ = -(uint)(ABS(fVar115 * fStack_1010) < ABS(fVar137 * fVar158));
        auVar46._12_4_ = -(uint)(ABS(fVar116 * fStack_100c) < ABS(fVar138 * fVar160));
        local_10f8 = blendvps(auVar113,auVar98,auVar46);
        auVar92._0_4_ = local_1018 * fVar60 - fVar134 * fVar117;
        auVar92._4_4_ = fStack_1014 * fVar66 - fVar136 * fVar119;
        auVar92._8_4_ = fStack_1010 * fVar151 - fVar137 * fVar121;
        auVar92._12_4_ = fStack_100c * fVar67 - fVar138 * fVar123;
        auVar135._0_4_ = fVar134 * fVar118 - fVar60 * fVar126;
        auVar135._4_4_ = fVar136 * fVar120 - fVar66 * fVar128;
        auVar135._8_4_ = fVar137 * fVar122 - fVar151 * fVar130;
        auVar135._12_4_ = fVar138 * fVar124 - fVar67 * fVar132;
        auVar47._4_4_ = -(uint)(ABS(fVar136 * fVar119) < ABS(fVar66 * fVar128));
        auVar47._0_4_ = -(uint)(ABS(fVar134 * fVar117) < ABS(fVar60 * fVar126));
        auVar47._8_4_ = -(uint)(ABS(fVar137 * fVar121) < ABS(fVar151 * fVar130));
        auVar47._12_4_ = -(uint)(ABS(fVar138 * fVar123) < ABS(fVar67 * fVar132));
        local_10e8 = blendvps(auVar135,auVar92,auVar47);
        auVar105._0_4_ = fVar60 * fVar154 - fVar112 * fVar118;
        auVar105._4_4_ = fVar66 * fVar156 - fVar114 * fVar120;
        auVar105._8_4_ = fVar151 * fVar158 - fVar115 * fVar122;
        auVar105._12_4_ = fVar67 * fVar160 - fVar116 * fVar124;
        auVar48._4_4_ = -(uint)(ABS(fVar66 * fVar143) < ABS(fVar114 * fVar120));
        auVar48._0_4_ = -(uint)(ABS(fVar60 * fVar140) < ABS(fVar112 * fVar118));
        auVar48._8_4_ = -(uint)(ABS(fVar151 * fVar144) < ABS(fVar115 * fVar122));
        auVar48._12_4_ = -(uint)(ABS(fVar67 * fVar145) < ABS(fVar116 * fVar124));
        auVar12._4_4_ = fVar119 * fVar114 - fVar66 * fVar143;
        auVar12._0_4_ = fVar117 * fVar112 - fVar60 * fVar140;
        auVar12._8_4_ = fVar121 * fVar115 - fVar151 * fVar144;
        auVar12._12_4_ = fVar123 * fVar116 - fVar67 * fVar145;
        local_10d8 = blendvps(auVar105,auVar12,auVar48);
        fVar59 = fVar146 * local_10f8._0_4_ +
                 fVar133 * local_10e8._0_4_ + fVar139 * local_10d8._0_4_;
        fVar89 = fVar146 * local_10f8._4_4_ +
                 fVar133 * local_10e8._4_4_ + fVar139 * local_10d8._4_4_;
        fVar111 = fVar146 * local_10f8._8_4_ +
                  fVar133 * local_10e8._8_4_ + fVar139 * local_10d8._8_4_;
        fVar133 = fVar146 * local_10f8._12_4_ +
                  fVar133 * local_10e8._12_4_ + fVar139 * local_10d8._12_4_;
        auVar141._0_4_ = fVar59 + fVar59;
        auVar141._4_4_ = fVar89 + fVar89;
        auVar141._8_4_ = fVar111 + fVar111;
        auVar141._12_4_ = fVar133 + fVar133;
        auVar49._0_4_ = fVar125 * local_10e8._0_4_ + fVar147 * local_10d8._0_4_;
        auVar49._4_4_ = fVar127 * local_10e8._4_4_ + fVar148 * local_10d8._4_4_;
        auVar49._8_4_ = fVar129 * local_10e8._8_4_ + fVar149 * local_10d8._8_4_;
        auVar49._12_4_ = fVar131 * local_10e8._12_4_ + fVar150 * local_10d8._12_4_;
        fVar139 = fVar153 * local_10f8._0_4_ + auVar49._0_4_;
        fVar146 = fVar155 * local_10f8._4_4_ + auVar49._4_4_;
        fVar32 = fVar157 * local_10f8._8_4_ + auVar49._8_4_;
        fVar33 = fVar159 * local_10f8._12_4_ + auVar49._12_4_;
        auVar44 = rcpps(auVar49,auVar141);
        fVar59 = auVar44._0_4_;
        fVar89 = auVar44._4_4_;
        fVar111 = auVar44._8_4_;
        fVar133 = auVar44._12_4_;
        fVar139 = ((1.0 - auVar141._0_4_ * fVar59) * fVar59 + fVar59) * (fVar139 + fVar139);
        fVar146 = ((1.0 - auVar141._4_4_ * fVar89) * fVar89 + fVar89) * (fVar146 + fVar146);
        fVar111 = ((1.0 - auVar141._8_4_ * fVar111) * fVar111 + fVar111) * (fVar32 + fVar32);
        fVar133 = ((1.0 - auVar141._12_4_ * fVar133) * fVar133 + fVar133) * (fVar33 + fVar33);
        fVar89 = *(float *)(ray + k * 4 + 0x80);
        fVar59 = *(float *)(ray + k * 4 + 0x30);
        auVar61._4_4_ = -(uint)(fVar59 <= fVar146);
        auVar61._0_4_ = -(uint)(fVar59 <= fVar139);
        auVar61._8_4_ = -(uint)(fVar59 <= fVar111);
        auVar61._12_4_ = -(uint)(fVar59 <= fVar133);
        auVar50._0_4_ = -(uint)(fVar139 <= fVar89 && fVar59 <= fVar139) & auVar84._0_4_;
        auVar50._4_4_ = -(uint)(fVar146 <= fVar89 && fVar59 <= fVar146) & auVar84._4_4_;
        auVar50._8_4_ = -(uint)(fVar111 <= fVar89 && fVar59 <= fVar111) & auVar84._8_4_;
        auVar50._12_4_ = -(uint)(fVar133 <= fVar89 && fVar59 <= fVar133) & auVar84._12_4_;
        uVar14 = movmskps(uVar14,auVar50);
        uVar27 = (ulong)uVar14;
        if (uVar14 != 0) {
          valid.field_0.i[0] = auVar50._0_4_ & -(uint)(auVar141._0_4_ != 0.0);
          valid.field_0.i[1] = auVar50._4_4_ & -(uint)(auVar141._4_4_ != 0.0);
          valid.field_0.i[2] = auVar50._8_4_ & -(uint)(auVar141._8_4_ != 0.0);
          valid.field_0.i[3] = auVar50._12_4_ & -(uint)(auVar141._12_4_ != 0.0);
          uVar14 = movmskps(uVar14,(undefined1  [16])valid.field_0);
          uVar27 = (ulong)uVar14;
          if (uVar14 != 0) {
            tNear.field_0.v[1] = fStack_1044;
            tNear.field_0.v[0] = local_1048;
            tNear.field_0.v[2] = fStack_1040;
            tNear.field_0.v[3] = fStack_103c;
            auVar13._4_4_ = fStack_1034;
            auVar13._0_4_ = local_1038;
            auVar13._8_4_ = fStack_1030;
            auVar13._12_4_ = fStack_102c;
            local_1108[0] = fVar139;
            local_1108[1] = fVar146;
            local_1108[2] = fVar111;
            local_1108[3] = fVar133;
            pSVar7 = context->scene;
            auVar44 = rcpps(auVar61,auVar13);
            fVar59 = auVar44._0_4_;
            fVar32 = auVar44._4_4_;
            fVar33 = auVar44._8_4_;
            fVar54 = auVar44._12_4_;
            fVar59 = (float)(-(uint)(1e-18 <= ABS(local_1038)) &
                            (uint)(((float)DAT_01f46a60 - local_1038 * fVar59) * fVar59 + fVar59));
            fVar32 = (float)(-(uint)(1e-18 <= ABS(fStack_1034)) &
                            (uint)((DAT_01f46a60._4_4_ - fStack_1034 * fVar32) * fVar32 + fVar32));
            fVar33 = (float)(-(uint)(1e-18 <= ABS(fStack_1030)) &
                            (uint)((DAT_01f46a60._8_4_ - fStack_1030 * fVar33) * fVar33 + fVar33));
            fVar54 = (float)(-(uint)(1e-18 <= ABS(fStack_102c)) &
                            (uint)((DAT_01f46a60._12_4_ - fStack_102c * fVar54) * fVar54 + fVar54));
            auVar142._0_4_ = local_1048 * fVar59;
            auVar142._4_4_ = fStack_1044 * fVar32;
            auVar142._8_4_ = fStack_1040 * fVar33;
            auVar142._12_4_ = fStack_103c * fVar54;
            local_1128 = minps(auVar142,_DAT_01f46a60);
            auVar108._0_4_ = fVar59 * local_1028._0_4_;
            auVar108._4_4_ = fVar32 * local_1028._4_4_;
            auVar108._8_4_ = fVar33 * local_1028._8_4_;
            auVar108._12_4_ = fVar54 * local_1028._12_4_;
            local_1118 = minps(auVar108,_DAT_01f46a60);
            auVar10._4_4_ = fVar146;
            auVar10._0_4_ = fVar139;
            auVar10._8_4_ = fVar111;
            auVar10._12_4_ = fVar133;
            auVar34 = blendvps(_DAT_01f45a30,auVar10,(undefined1  [16])valid.field_0);
            auVar85._4_4_ = auVar34._0_4_;
            auVar85._0_4_ = auVar34._4_4_;
            auVar85._8_4_ = auVar34._12_4_;
            auVar85._12_4_ = auVar34._8_4_;
            auVar44 = minps(auVar85,auVar34);
            auVar62._0_8_ = auVar44._8_8_;
            auVar62._8_4_ = auVar44._0_4_;
            auVar62._12_4_ = auVar44._4_4_;
            auVar44 = minps(auVar62,auVar44);
            uVar14 = -(uint)(auVar44._0_4_ == auVar34._0_4_);
            uVar29 = -(uint)(auVar44._4_4_ == auVar34._4_4_);
            uVar30 = -(uint)(auVar44._8_4_ == auVar34._8_4_);
            uVar31 = -(uint)(auVar44._12_4_ == auVar34._12_4_);
            auVar75._4_4_ = uVar29;
            auVar75._0_4_ = uVar14;
            auVar73._0_4_ = uVar14 & valid.field_0.i[0];
            auVar73._4_4_ = uVar29 & valid.field_0.i[1];
            auVar73._8_4_ = uVar30 & valid.field_0.i[2];
            auVar73._12_4_ = uVar31 & valid.field_0.i[3];
            iVar15 = movmskps((int)pSVar7,auVar73);
            auVar74._8_4_ = 0xffffffff;
            auVar74._0_8_ = 0xffffffffffffffff;
            auVar74._12_4_ = 0xffffffff;
            if (iVar15 != 0) {
              auVar75._8_4_ = uVar30;
              auVar75._12_4_ = uVar31;
              auVar74 = auVar75;
            }
            lVar20 = lVar20 + uVar28;
            auVar51._0_4_ = valid.field_0.i[0] & auVar74._0_4_;
            auVar51._4_4_ = valid.field_0.i[1] & auVar74._4_4_;
            auVar51._8_4_ = valid.field_0.i[2] & auVar74._8_4_;
            auVar51._12_4_ = valid.field_0.i[3] & auVar74._12_4_;
            uVar16 = movmskps(iVar15,auVar51);
            uVar27 = CONCAT44((int)((ulong)pSVar7 >> 0x20),uVar16);
            lVar19 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
LAB_006efa69:
            uVar14 = *(uint *)(lVar20 + 0x90 + lVar19 * 4);
            pGVar8 = (pSVar7->geometries).items[uVar14].ptr;
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[lVar19] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar16 = *(undefined4 *)(local_1128 + lVar19 * 4);
                fVar59 = local_1108[lVar19 + -4];
                *(float *)(ray + k * 4 + 0x80) = local_1108[lVar19];
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_10f8 + lVar19 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_10e8 + lVar19 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_10d8 + lVar19 * 4);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar16;
                *(float *)(ray + k * 4 + 0x100) = fVar59;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar20 + 0xa0 + lVar19 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar14;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                uVar14 = context->user->instPrimID[0];
                uVar27 = (ulong)uVar14;
                *(uint *)(ray + k * 4 + 0x140) = uVar14;
                goto LAB_006eff68;
              }
              local_fd8 = *(undefined4 *)(local_1128 + lVar19 * 4);
              local_fc8 = local_1108[lVar19 + -4];
              uVar16 = *(undefined4 *)(local_10f8 + lVar19 * 4);
              uVar17 = *(undefined4 *)(local_10e8 + lVar19 * 4);
              local_fa8._4_4_ = uVar14;
              local_fa8._0_4_ = uVar14;
              local_fa8._8_4_ = uVar14;
              local_fa8._12_4_ = uVar14;
              uVar5 = *(undefined4 *)(lVar20 + 0xa0 + lVar19 * 4);
              local_fb8._4_4_ = uVar5;
              local_fb8._0_4_ = uVar5;
              local_fb8._8_4_ = uVar5;
              local_fb8._12_4_ = uVar5;
              local_ff8._4_4_ = uVar17;
              local_ff8._0_4_ = uVar17;
              local_ff8._8_4_ = uVar17;
              local_ff8._12_4_ = uVar17;
              uVar17 = *(undefined4 *)(local_10d8 + lVar19 * 4);
              local_fe8._4_4_ = uVar17;
              local_fe8._0_4_ = uVar17;
              local_fe8._8_4_ = uVar17;
              local_fe8._12_4_ = uVar17;
              local_1008[0] = (RTCHitN)(char)uVar16;
              local_1008[1] = (RTCHitN)(char)((uint)uVar16 >> 8);
              local_1008[2] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
              local_1008[3] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
              local_1008[4] = (RTCHitN)(char)uVar16;
              local_1008[5] = (RTCHitN)(char)((uint)uVar16 >> 8);
              local_1008[6] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
              local_1008[7] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
              local_1008[8] = (RTCHitN)(char)uVar16;
              local_1008[9] = (RTCHitN)(char)((uint)uVar16 >> 8);
              local_1008[10] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
              local_1008[0xb] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
              local_1008[0xc] = (RTCHitN)(char)uVar16;
              local_1008[0xd] = (RTCHitN)(char)((uint)uVar16 >> 8);
              local_1008[0xe] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
              local_1008[0xf] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
              uStack_fd4 = local_fd8;
              uStack_fd0 = local_fd8;
              uStack_fcc = local_fd8;
              fStack_fc4 = local_fc8;
              fStack_fc0 = local_fc8;
              fStack_fbc = local_fc8;
              local_f98 = context->user->instID[0];
              uStack_f94 = local_f98;
              uStack_f90 = local_f98;
              uStack_f8c = local_f98;
              local_f88 = context->user->instPrimID[0];
              uStack_f84 = local_f88;
              uStack_f80 = local_f88;
              uStack_f7c = local_f88;
              *(float *)(ray + k * 4 + 0x80) = local_1108[lVar19];
              local_11e8 = *local_11d8;
              args.valid = (int *)local_11e8;
              args.geometryUserPtr = pGVar8->userPtr;
              args.context = context->user;
              args.hit = local_1008;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar8->intersectionFilterN)(&args);
              }
              if (local_11e8 == (undefined1  [16])0x0) {
                auVar63._8_4_ = 0xffffffff;
                auVar63._0_8_ = 0xffffffffffffffff;
                auVar63._12_4_ = 0xffffffff;
                auVar63 = auVar63 ^ _DAT_01f46b70;
              }
              else {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var9)(&args);
                }
                auVar52._0_4_ = -(uint)(local_11e8._0_4_ == 0);
                auVar52._4_4_ = -(uint)(local_11e8._4_4_ == 0);
                auVar52._8_4_ = -(uint)(local_11e8._8_4_ == 0);
                auVar52._12_4_ = -(uint)(local_11e8._12_4_ == 0);
                auVar63 = auVar52 ^ _DAT_01f46b70;
                if (local_11e8 != (undefined1  [16])0x0) {
                  auVar44 = blendvps(*(undefined1 (*) [16])args.hit,
                                     *(undefined1 (*) [16])(args.ray + 0xc0),auVar52);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar44;
                  auVar44 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                     *(undefined1 (*) [16])(args.ray + 0xd0),auVar52);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar44;
                  auVar44 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                     *(undefined1 (*) [16])(args.ray + 0xe0),auVar52);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar44;
                  auVar44 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                     *(undefined1 (*) [16])(args.ray + 0xf0),auVar52);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar44;
                  auVar44 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                     *(undefined1 (*) [16])(args.ray + 0x100),auVar52);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar44;
                  auVar44 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                     *(undefined1 (*) [16])(args.ray + 0x110),auVar52);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar44;
                  auVar44 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                     *(undefined1 (*) [16])(args.ray + 0x120),auVar52);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar44;
                  auVar44 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                     *(undefined1 (*) [16])(args.ray + 0x130),auVar52);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar44;
                  auVar44 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                     *(undefined1 (*) [16])(args.ray + 0x140),auVar52);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar44;
                }
              }
              if ((_DAT_01f46b40 & auVar63) == (undefined1  [16])0x0) {
                *(float *)(ray + k * 4 + 0x80) = fVar89;
              }
              else {
                fVar89 = *(float *)(ray + k * 4 + 0x80);
              }
              valid.field_0.v[lVar19] = 0.0;
              valid.field_0.i[0] = -(uint)(fVar139 <= fVar89) & valid.field_0.i[0];
              valid.field_0.i[1] = -(uint)(fVar146 <= fVar89) & valid.field_0.i[1];
              valid.field_0.i[2] = -(uint)(fVar111 <= fVar89) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(fVar133 <= fVar89) & valid.field_0.i[3];
            }
            uVar16 = (undefined4)((ulong)lVar19 >> 0x20);
            iVar15 = movmskps((int)lVar19,(undefined1  [16])valid.field_0);
            uVar27 = CONCAT44(uVar16,iVar15);
            if (iVar15 == 0) goto LAB_006eff68;
            auVar11._4_4_ = fVar146;
            auVar11._0_4_ = fVar139;
            auVar11._8_4_ = fVar111;
            auVar11._12_4_ = fVar133;
            auVar34 = blendvps(_DAT_01f45a30,auVar11,(undefined1  [16])valid.field_0);
            auVar86._4_4_ = auVar34._0_4_;
            auVar86._0_4_ = auVar34._4_4_;
            auVar86._8_4_ = auVar34._12_4_;
            auVar86._12_4_ = auVar34._8_4_;
            auVar44 = minps(auVar86,auVar34);
            auVar64._0_8_ = auVar44._8_8_;
            auVar64._8_4_ = auVar44._0_4_;
            auVar64._12_4_ = auVar44._4_4_;
            auVar44 = minps(auVar64,auVar44);
            auVar65._0_8_ =
                 CONCAT44(-(uint)(auVar44._4_4_ == auVar34._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar44._0_4_ == auVar34._0_4_) & valid.field_0._0_4_);
            auVar65._8_4_ = -(uint)(auVar44._8_4_ == auVar34._8_4_) & valid.field_0._8_4_;
            auVar65._12_4_ = -(uint)(auVar44._12_4_ == auVar34._12_4_) & valid.field_0._12_4_;
            iVar15 = movmskps(iVar15,auVar65);
            aVar53 = valid.field_0;
            if (iVar15 != 0) {
              aVar53.i[2] = auVar65._8_4_;
              aVar53._0_8_ = auVar65._0_8_;
              aVar53.i[3] = auVar65._12_4_;
            }
            uVar17 = movmskps(iVar15,(undefined1  [16])aVar53);
            uVar27 = CONCAT44(uVar16,uVar17);
            lVar19 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            goto LAB_006efa69;
          }
        }
      }
LAB_006eff68:
      fVar89 = local_1068;
      fVar32 = fStack_1064;
      fVar33 = fStack_1060;
      fVar54 = fStack_105c;
      fVar111 = local_1078;
      fVar55 = fStack_1074;
      fVar56 = fStack_1070;
      fVar57 = fStack_106c;
      fVar146 = local_10a8;
      fVar58 = fStack_10a4;
      fVar60 = fStack_10a0;
      fVar66 = fStack_109c;
      fVar151 = local_10b8;
      fVar67 = fStack_10b4;
      fVar68 = fStack_10b0;
      fVar76 = fStack_10ac;
      fVar152 = local_10c8;
      fVar77 = fStack_10c4;
      fVar78 = fStack_10c0;
      fVar87 = fStack_10bc;
      fVar59 = local_1058;
      fVar88 = fStack_1054;
      fVar93 = fStack_1050;
      fVar99 = fStack_104c;
      fVar133 = local_1088;
      fVar100 = fStack_1084;
      fVar101 = fStack_1080;
      fVar106 = fStack_107c;
      fVar139 = local_1098;
      fVar109 = fStack_1094;
      fVar110 = fStack_1090;
      fVar112 = fStack_108c;
    }
    uVar16 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar44._4_4_ = uVar16;
    auVar44._0_4_ = uVar16;
    auVar44._8_4_ = uVar16;
    auVar44._12_4_ = uVar16;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }